

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void cashew::ValueBuilder::appendToObjectAsSetter(Ref array,IString key,IString param,Ref value)

{
  Value *this;
  char *pcVar1;
  bool bVar2;
  Ref *pRVar3;
  Value *pVVar4;
  Value *pVVar5;
  Ref RVar6;
  void *pvVar7;
  Ref local_70;
  Ref array_local;
  
  local_70.inst = array.inst;
  array_local = value;
  pRVar3 = Ref::operator[](&local_70,0);
  bVar2 = Ref::operator==(pRVar3,(IString *)&OBJECT);
  if (bVar2) {
    pRVar3 = Ref::operator[](&local_70,1);
    this = pRVar3->inst;
    pVVar4 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    pVVar4->type = Null;
    pVVar4 = cashew::Value::setArray(pVVar4,2);
    pVVar5 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    pVVar5->type = Null;
    pVVar5 = cashew::Value::setArray(pVVar5,3);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    (RVar6.inst)->type = Null;
    cashew::Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    pcVar1 = DAT_010b17d0;
    ((RVar6.inst)->field_1).str.str._M_len = SETTER;
    ((RVar6.inst)->field_1).str.str._M_str = pcVar1;
    pVVar5 = cashew::Value::push_back(pVVar5,RVar6);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    (RVar6.inst)->type = Null;
    cashew::Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    ((RVar6.inst)->field_1).str.str._M_len = key.str._M_len;
    ((RVar6.inst)->field_1).str.str._M_str = key.str._M_str;
    pVVar5 = cashew::Value::push_back(pVVar5,RVar6);
    pvVar7 = (void *)0x18;
    RVar6.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    (RVar6.inst)->type = Null;
    cashew::Value::free(RVar6.inst,pvVar7);
    (RVar6.inst)->type = String;
    ((RVar6.inst)->field_1).str.str._M_len = param.str._M_len;
    ((RVar6.inst)->field_1).str.str._M_str = param.str._M_str;
    RVar6.inst = cashew::Value::push_back(pVVar5,RVar6);
    pVVar4 = cashew::Value::push_back(pVVar4,RVar6);
    RVar6.inst = cashew::Value::push_back(pVVar4,array_local);
    cashew::Value::push_back(this,RVar6);
    return;
  }
  __assert_fail("array[0] == OBJECT",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x742,
                "static void cashew::ValueBuilder::appendToObjectAsSetter(Ref, IString, IString, Ref)"
               );
}

Assistant:

static void
  appendToObjectAsSetter(Ref array, IString key, IString param, Ref value) {
    assert(array[0] == OBJECT);
    array[1]->push_back(&makeRawArray(2)
                           ->push_back(&makeRawArray(3)
                                          ->push_back(makeRawString(SETTER))
                                          .push_back(makeRawString(key))
                                          .push_back(makeRawString(param)))
                           .push_back(value));
  }